

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

uint mp_cmp_hs(mp_int *a,mp_int *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  BignumInt BVar7;
  
  uVar1 = a->nw;
  uVar2 = b->nw;
  uVar4 = uVar2;
  if (uVar2 < uVar1) {
    uVar4 = uVar1;
  }
  if (uVar4 != 0) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      if (uVar5 < uVar1) {
        BVar7 = a->w[uVar5];
      }
      else {
        BVar7 = 0;
      }
      uVar3 = 0xffffffffffffffff;
      if (uVar5 < uVar2) {
        uVar3 = ~b->w[uVar5];
      }
      uVar6 = (ulong)CARRY8(BVar7,uVar6) + (ulong)CARRY8(BVar7 + uVar6,uVar3);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    return (uint)uVar6;
  }
  return 1;
}

Assistant:

unsigned mp_cmp_hs(mp_int *a, mp_int *b)
{
    size_t rw = size_t_max(a->nw, b->nw);
    return mp_add_masked_into(NULL, rw, a, b, ~(BignumInt)0, ~(BignumInt)0, 1);
}